

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImGui::RenderMouseCursor
               (ImDrawList *draw_list,ImVec2 pos,float scale,ImGuiMouseCursor mouse_cursor,
               ImU32 col_fill,ImU32 col_border,ImU32 col_shadow)

{
  ImFontAtlas *this;
  ImTextureID texture_id;
  bool bVar1;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float in_XMM1_Db;
  ImVec2 uv [4];
  ImVec2 local_e8;
  ImU32 local_e0;
  ImU32 local_dc;
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 IStack_90;
  ImVec2 local_88;
  ImVec2 IStack_80;
  ImVec2 local_78;
  undefined8 uStack_70;
  float local_68;
  float fStack_64;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  if (mouse_cursor != -1) {
    fStack_d0 = (float)in_XMM0_Dc;
    local_d8 = (undefined1  [8])pos;
    fStack_cc = (float)in_XMM0_Dd;
    local_68 = scale;
    if (8 < (uint)mouse_cursor) {
      __assert_fail("mouse_cursor > ImGuiMouseCursor_None && mouse_cursor < ImGuiMouseCursor_COUNT",
                    "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_draw.cpp"
                    ,0xd8c,
                    "void ImGui::RenderMouseCursor(ImDrawList *, ImVec2, float, ImGuiMouseCursor, ImU32, ImU32, ImU32)"
                   );
    }
    this = draw_list->_Data->Font->ContainerAtlas;
    local_a8.x = 0.0;
    local_a8.y = 0.0;
    local_b0.x = 0.0;
    local_b0.y = 0.0;
    local_88.x = 0.0;
    local_88.y = 0.0;
    IStack_80.x = 0.0;
    IStack_80.y = 0.0;
    local_98.x = 0.0;
    local_98.y = 0.0;
    IStack_90.x = 0.0;
    IStack_90.y = 0.0;
    fStack_64 = in_XMM1_Db;
    bVar1 = ImFontAtlas::GetMouseCursorTexData
                      (this,mouse_cursor,&local_a8,&local_b0,&local_98,&local_88);
    if (bVar1) {
      local_d8._0_4_ = (float)local_d8._0_4_ - local_a8.x;
      local_d8._4_4_ = (float)local_d8._4_4_ - local_a8.y;
      fStack_d0 = fStack_d0 - 0.0;
      fStack_cc = fStack_cc - 0.0;
      local_a0.y = (float)local_d8._4_4_;
      local_a0.x = (float)local_d8._0_4_;
      texture_id = this->TexID;
      ImDrawList::PushTextureID(draw_list,texture_id);
      local_48 = local_68 + (float)local_d8._0_4_;
      fStack_44 = local_68 * 0.0 + (float)local_d8._4_4_;
      fStack_40 = fStack_64 + fStack_d0;
      fStack_3c = fStack_cc + 0.0;
      local_e8.y = fStack_44;
      local_e8.x = local_48;
      local_78 = local_b0;
      uStack_70 = 0;
      local_c8 = local_68;
      fStack_c4 = local_68;
      fStack_c0 = local_68;
      fStack_bc = local_68;
      local_58 = (local_b0.x + 1.0) * local_68 + (float)local_d8._0_4_;
      fStack_54 = (local_b0.y + 0.0) * local_68 + (float)local_d8._4_4_;
      fStack_50 = local_68 * 0.0 + fStack_d0;
      fStack_4c = local_68 * 0.0 + fStack_cc;
      local_b8.y = fStack_54;
      local_b8.x = local_58;
      local_e0 = col_border;
      local_dc = col_fill;
      ImDrawList::AddImage(draw_list,texture_id,&local_e8,&local_b8,&local_88,&IStack_80,col_shadow)
      ;
      local_e8.y = fStack_44;
      local_e8.x = local_68 + local_68 + (float)local_d8._0_4_;
      local_b8.y = fStack_54;
      local_b8.x = (local_78.x + 2.0) * local_68 + (float)local_d8._0_4_;
      ImDrawList::AddImage(draw_list,texture_id,&local_e8,&local_b8,&local_88,&IStack_80,col_shadow)
      ;
      local_c8 = local_c8 * local_78.x + (float)local_d8._0_4_;
      fStack_c4 = fStack_c4 * local_78.y + (float)local_d8._4_4_;
      fStack_c0 = fStack_c0 * (float)uStack_70 + fStack_d0;
      fStack_bc = fStack_bc * uStack_70._4_4_ + fStack_cc;
      local_e8.y = fStack_c4;
      local_e8.x = local_c8;
      ImDrawList::AddImage(draw_list,texture_id,&local_a0,&local_e8,&local_88,&IStack_80,local_e0);
      local_e8.y = fStack_c4;
      local_e8.x = local_c8;
      ImDrawList::AddImage(draw_list,texture_id,&local_a0,&local_e8,&local_98,&IStack_90,local_dc);
      ImDrawList::PopTextureID(draw_list);
    }
  }
  return;
}

Assistant:

void ImGui::RenderMouseCursor(ImDrawList* draw_list, ImVec2 pos, float scale, ImGuiMouseCursor mouse_cursor, ImU32 col_fill, ImU32 col_border, ImU32 col_shadow)
{
    if (mouse_cursor == ImGuiMouseCursor_None)
        return;
    IM_ASSERT(mouse_cursor > ImGuiMouseCursor_None && mouse_cursor < ImGuiMouseCursor_COUNT);

    ImFontAtlas* font_atlas = draw_list->_Data->Font->ContainerAtlas;
    ImVec2 offset, size, uv[4];
    if (font_atlas->GetMouseCursorTexData(mouse_cursor, &offset, &size, &uv[0], &uv[2]))
    {
        pos -= offset;
        const ImTextureID tex_id = font_atlas->TexID;
        draw_list->PushTextureID(tex_id);
        draw_list->AddImage(tex_id, pos + ImVec2(1, 0) * scale, pos + (ImVec2(1, 0) + size) * scale,    uv[2], uv[3], col_shadow);
        draw_list->AddImage(tex_id, pos + ImVec2(2, 0) * scale, pos + (ImVec2(2, 0) + size) * scale,    uv[2], uv[3], col_shadow);
        draw_list->AddImage(tex_id, pos,                        pos + size * scale,                     uv[2], uv[3], col_border);
        draw_list->AddImage(tex_id, pos,                        pos + size * scale,                     uv[0], uv[1], col_fill);
        draw_list->PopTextureID();
    }
}